

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

wchar_t terminal_gettc(EditLine *el,wchar_t argc,char **argv)

{
  int *piVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  
  if (((argv != (char **)0x0) && (pcVar4 = argv[1], pcVar4 != (char *)0x0)) &&
     (piVar1 = (int *)argv[2], piVar1 != (int *)0x0)) {
    for (lVar6 = 0; pcVar2 = *(char **)((long)&tstr[0].name + lVar6), pcVar2 != (char *)0x0;
        lVar6 = lVar6 + 0x10) {
      iVar3 = strcmp(pcVar2,pcVar4);
      if (iVar3 == 0) {
        *(undefined8 *)piVar1 = *(undefined8 *)((long)(el->el_terminal).t_str + (lVar6 >> 1));
        return L'\0';
      }
    }
    lVar6 = 0;
    for (uVar5 = 0; pcVar2 = *(char **)((long)&tval[0].name + uVar5), pcVar2 != (char *)0x0;
        uVar5 = uVar5 + 0x10) {
      iVar3 = strcmp(pcVar2,pcVar4);
      if (iVar3 == 0) {
        iVar3 = *(int *)((long)(el->el_terminal).t_val + lVar6);
        if (uVar5 < 0x20 || (uVar5 & 0x7fffffffffffffd0) == 0x40) {
          pcVar4 = terminal_gettc::yes;
          if (iVar3 == 0) {
            pcVar4 = terminal_gettc::no;
          }
          *(char **)piVar1 = pcVar4;
        }
        else {
          *piVar1 = iVar3;
        }
        return L'\0';
      }
      lVar6 = lVar6 + 4;
    }
  }
  return L'\xffffffff';
}

Assistant:

libedit_private int
/*ARGSUSED*/
terminal_gettc(EditLine *el, int argc __attribute__((__unused__)), char **argv)
{
	const struct termcapstr *ts;
	const struct termcapval *tv;
	char *what;
	void *how;

	if (argv == NULL || argv[1] == NULL || argv[2] == NULL)
		return -1;

	what = argv[1];
	how = argv[2];

	/*
         * Do the strings first
         */
	for (ts = tstr; ts->name != NULL; ts++)
		if (strcmp(ts->name, what) == 0)
			break;

	if (ts->name != NULL) {
		*(char **)how = el->el_terminal.t_str[ts - tstr];
		return 0;
	}
	/*
         * Do the numeric ones second
         */
	for (tv = tval; tv->name != NULL; tv++)
		if (strcmp(tv->name, what) == 0)
			break;

	if (tv->name == NULL)
		return -1;

	if (tv == &tval[T_pt] || tv == &tval[T_km] ||
	    tv == &tval[T_am] || tv == &tval[T_xn]) {
		static char yes[] = "yes";
		static char no[] = "no";
		if (el->el_terminal.t_val[tv - tval])
			*(char **)how = yes;
		else
			*(char **)how = no;
		return 0;
	} else {
		*(int *)how = el->el_terminal.t_val[tv - tval];
		return 0;
	}
}